

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcborvalue.cpp
# Opt level: O2

int compareStringsInUtf8(QUtf8StringView lhs,QStringView rhs,Comparison mode)

{
  char16_t *end;
  char16_t u;
  int iVar1;
  qsizetype qVar2;
  long lVar3;
  size_t __n;
  long lVar4;
  long lVar5;
  long in_FS_OFFSET;
  bool bVar6;
  uchar *ptr;
  char16_t *local_48;
  uchar local_3c [4];
  long local_38;
  
  lVar4 = lhs.m_size;
  local_48 = rhs.m_data;
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  end = local_48 + rhs.m_size;
  lVar5 = 0;
  lVar3 = 0;
  do {
    local_3c[0] = 0xaa;
    local_3c[1] = 0xaa;
    local_3c[2] = 0xaa;
    local_3c[3] = 0xaa;
    u = *local_48;
    ptr = local_3c;
    local_48 = local_48 + 1;
    QUtf8Functions::toUtf8<QUtf8BaseTraits,unsigned_char*,char16_t_const*>(u,&ptr,&local_48,end);
    __n = (long)ptr - (long)local_3c;
    if (lVar4 - lVar3 < (long)__n) {
      iVar1 = -1;
      goto LAB_002ba08a;
    }
    lVar5 = lVar5 + __n;
    iVar1 = memcmp(lhs.m_data + lVar3,local_3c,__n);
    lVar3 = lVar3 + __n;
  } while (((iVar1 == 0) && (lVar3 < lVar4)) && (local_48 < end));
  if ((mode != ForEquality) || (iVar1 == 0)) {
    if ((local_48 != end) == (lVar3 == lVar4)) {
      bVar6 = lVar3 != lVar4;
    }
    else {
      qVar2 = stringLengthInUtf8(local_48,end);
      if (qVar2 + lVar5 == lVar4) goto LAB_002ba08a;
      bVar6 = qVar2 + lVar5 <= lVar4;
    }
    iVar1 = (uint)bVar6 * 2 + -1;
  }
LAB_002ba08a:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return iVar1;
  }
  __stack_chk_fail();
}

Assistant:

static int compareStringsInUtf8(QUtf8StringView lhs, QStringView rhs, Comparison mode) noexcept
{
    // CBOR requires that the shortest of the two strings be sorted first, so
    // we have to calculate the UTF-8 length of the UTF-16 string while
    // comparing. Unlike the UTF-32 comparison above, we convert the UTF-16
    // string to UTF-8 so we only need to decode one string.

    const qsizetype len1 = lhs.size();
    const auto src1 = reinterpret_cast<const uchar *>(lhs.data());
    const char16_t *src2 = rhs.utf16();
    const char16_t *const end2 = src2 + rhs.size();

    // Compare the two strings until we find a difference.
    int diff = 0;
    qptrdiff idx1 = 0;
    qsizetype len2 = 0;
    do {
        uchar utf8[4];      // longest possible Unicode character in UTF-8
        uchar *ptr = utf8;
        char16_t uc = *src2++;
        int r = QUtf8Functions::toUtf8<QUtf8BaseTraits>(uc, ptr, src2, end2);
        Q_UNUSED(r);    // ignore failure to encode proper UTF-16 surrogates

        qptrdiff n = ptr - utf8;
        len2 += n;
        if (len1 - idx1 < n)
            return -1;      // lhs is definitely shorter
        diff = memcmp(src1 + idx1, utf8, n);
        idx1 += n;
    } while (diff == 0 && idx1 < len1 && src2 < end2);

    if (mode == Comparison::ForEquality && diff)
        return diff;
    if ((idx1 == len1) != (src2 == end2)) {
        // One of the strings ended earlier than the other
        return idx1 == len1 ? -1 : 1;
    }

    // We found a difference and neither string ended, so continue calculating
    // the UTF-8 length of rhs.
    len2 += stringLengthInUtf8(src2, end2);

    if (len1 != len2)
        return len1 < len2 ? -1 : 1;
    return diff;
}